

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_api.c
# Opt level: O0

pcp_flow_info_t * pcp_flow_get_info(pcp_flow_t *f,size_t *info_count)

{
  uint32_t uVar1;
  ulong uVar2;
  uint local_3c;
  pcp_flow_t *ppStack_38;
  uint32_t cnt;
  pcp_flow_info_t *info_iter;
  pcp_flow_info_t *info_buf;
  pcp_flow_t *fiter;
  size_t *info_count_local;
  pcp_flow_t *f_local;
  
  local_3c = 0;
  info_buf = (pcp_flow_info_t *)f;
  if (info_count == (size_t *)0x0) {
    f_local = (pcp_flow_t *)0x0;
  }
  else {
    for (; info_buf != (pcp_flow_info_t *)0x0;
        info_buf = (pcp_flow_info_t *)info_buf[1].lifetime_renew_s) {
      local_3c = local_3c + 1;
    }
    f_local = (pcp_flow_t *)calloc((ulong)local_3c,0x68);
    ppStack_38 = f_local;
    info_buf = (pcp_flow_info_t *)f;
    if (f_local == (pcp_flow_t *)0x0) {
      f_local = (pcp_flow_t *)0x0;
    }
    else {
      for (; info_buf != (pcp_flow_info_t *)0x0;
          info_buf = (pcp_flow_info_t *)info_buf[1].lifetime_renew_s) {
        uVar1 = info_buf[1].int_ip.__in6_u.__u6_addr32[0];
        if (uVar1 == 4) {
          *(undefined4 *)&ppStack_38->ctx = 3;
        }
        else if (uVar1 == 5) {
          *(undefined4 *)&ppStack_38->ctx = 1;
        }
        else if (uVar1 == 7) {
          *(undefined4 *)&ppStack_38->ctx = 4;
        }
        else {
          *(undefined4 *)&ppStack_38->ctx = 0;
        }
        *(undefined8 *)((long)&(ppStack_38->kd).pcp_server_ip.__in6_u + 8) =
             *(undefined8 *)((long)&info_buf[1].ext_ip.__in6_u + 4);
        uVar2 = (ulong)(info_buf->dst_ip).__in6_u.__u6_addr32[2];
        (ppStack_38->kd).scope_id = (int)uVar2;
        (ppStack_38->kd).nonce.n[0] = (int)(uVar2 >> 0x20);
        *(char *)((ppStack_38->kd).nonce.n + 1) = (char)info_buf[1].ext_ip.__in6_u.__u6_addr32[3];
        *(undefined8 *)((ppStack_38->kd).nonce.n + 2) =
             *(undefined8 *)((long)&(info_buf->pcp_server_ip).__in6_u + 0xc);
        *(undefined8 *)((long)&(ppStack_38->kd).field_5 + 4) =
             *(undefined8 *)((long)&(info_buf->ext_ip).__in6_u + 4);
        *(undefined8 *)((long)&ppStack_38->ctx + 4) =
             *(undefined8 *)((long)&(info_buf->ext_ip).__in6_u + 0xc);
        *(time_t *)&ppStack_38->kd = info_buf->recv_lifetime_end;
        *(int *)((long)&(ppStack_38->kd).field_5 + 0x10) = (int)info_buf->lifetime_renew_s;
        if (((info_buf->pcp_server_ip).__in6_u.__u6_addr8[8] == '\x01') ||
           ((info_buf->pcp_server_ip).__in6_u.__u6_addr8[8] == '\x02')) {
          *(undefined8 *)((long)&(ppStack_38->kd).field_5 + 0x14) =
               *(undefined8 *)((long)&(info_buf->int_ip).__in6_u + 8);
          *(undefined8 *)&ppStack_38->lifetime = *(undefined8 *)&info_buf->int_port;
          *(undefined8 *)((long)&(ppStack_38->kd).src_ip.__in6_u + 4) =
               *(undefined8 *)((long)&(info_buf->dst_ip).__in6_u + 0xc);
          *(undefined8 *)((long)&(ppStack_38->kd).src_ip.__in6_u + 0xc) =
               *(undefined8 *)(info_buf + 1);
          *(uint16_t *)((long)&(ppStack_38->kd).field_5 + 0xc) =
               (info_buf->int_ip).__in6_u.__u6_addr16[3];
          *(uint16_t *)((long)&ppStack_38->field_5 + 4) = (info_buf->dst_ip).__in6_u.__u6_addr16[0];
          (ppStack_38->kd).pcp_server_ip.__in6_u.__u6_addr16[2] =
               info_buf[1].pcp_server_ip.__in6_u.__u6_addr16[2];
          *(uint8_t *)((long)&ppStack_38->field_5 + 6) = (info_buf->int_ip).__in6_u.__u6_addr8[4];
        }
        else if ((info_buf->pcp_server_ip).__in6_u.__u6_addr8[8] == '\x03') {
          *(uint8_t *)((long)&ppStack_38->field_5 + 7) = (info_buf->dst_ip).__in6_u.__u6_addr8[0xe];
        }
        ppStack_38 = (pcp_flow_t *)((ppStack_38->field_5).map_peer.ext_ip.__in6_u.__u6_addr8 + 8);
      }
      *info_count = (ulong)local_3c;
    }
  }
  return (pcp_flow_info_t *)f_local;
}

Assistant:

pcp_flow_info_t *pcp_flow_get_info(pcp_flow_t *f, size_t *info_count) {
    pcp_flow_t *fiter;
    pcp_flow_info_t *info_buf;
    pcp_flow_info_t *info_iter;
    uint32_t cnt = 0;

    if (!info_count) {
        return NULL;
    }

    for (fiter = f; fiter; fiter = fiter->next_child) {
        ++cnt;
    }

    info_buf = (pcp_flow_info_t *)calloc(cnt, sizeof(pcp_flow_info_t));
    if (!info_buf) {
        PCP_LOG(PCP_LOGLVL_DEBUG, "%s", "Error allocating memory");
        return NULL;
    }

    for (fiter = f, info_iter = info_buf; fiter != NULL;
         fiter = fiter->next_child, ++info_iter) {

        switch (fiter->state) {
        case pfs_wait_after_short_life_error:
            info_iter->result = pcp_state_short_lifetime_error;
            break;
        case pfs_wait_for_lifetime_renew:
            info_iter->result = pcp_state_succeeded;
            break;
        case pfs_failed:
            info_iter->result = pcp_state_failed;
            break;
        default:
            info_iter->result = pcp_state_processing;
            break;
        }

        info_iter->recv_lifetime_end = fiter->recv_lifetime;
        info_iter->lifetime_renew_s = fiter->lifetime;
        info_iter->pcp_result_code = fiter->recv_result;
        memcpy(&info_iter->int_ip, &fiter->kd.src_ip, sizeof(struct in6_addr));
        memcpy(&info_iter->pcp_server_ip, &fiter->kd.pcp_server_ip,
               sizeof(info_iter->pcp_server_ip));
        info_iter->int_scope_id = fiter->kd.scope_id;
        if ((fiter->kd.operation == PCP_OPCODE_MAP) ||
            (fiter->kd.operation == PCP_OPCODE_PEER)) {
            memcpy(&info_iter->dst_ip, &fiter->kd.map_peer.dst_ip,
                   sizeof(info_iter->dst_ip));
            memcpy(&info_iter->ext_ip, &fiter->map_peer.ext_ip,
                   sizeof(info_iter->ext_ip));
            info_iter->int_port = fiter->kd.map_peer.src_port;
            info_iter->dst_port = fiter->kd.map_peer.dst_port;
            info_iter->ext_port = fiter->map_peer.ext_port;
            info_iter->protocol = fiter->kd.map_peer.protocol;
#ifdef PCP_SADSCP
        } else if (fiter->kd.operation == PCP_OPCODE_SADSCP) {
            info_iter->learned_dscp = fiter->sadscp.learned_dscp;
#endif
        }
    }
    *info_count = cnt;

    return info_buf;
}